

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O2

void __thiscall tokenizer::load_token_name_id(tokenizer *this)

{
  mapped_type *pmVar1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  key_type local_1c;
  
  this_00 = &this->name;
  local_1c = 1000;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3e9;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3ea;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3eb;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3ec;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3ed;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3ee;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3ef;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f0;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f1;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f2;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f3;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f4;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f5;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f6;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f7;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f8;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3f9;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3fa;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3fb;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3fc;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3fd;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3fe;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x3ff;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x400;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x401;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x402;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x403;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x404;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x405;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x406;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x407;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x408;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x409;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x40a;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x40b;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x40c;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x40d;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x40e;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x40f;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x410;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x411;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x412;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_1c = 0x413;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1c);
  std::__cxx11::string::assign((char *)pmVar1);
  return;
}

Assistant:

void load_token_name_id() {
        name[ID_SPACES]                   = "ID_SPACES";
        name[ID_CR]                       = "ID_CR";
        name[ID_LF]                       = "ID_LF";
        name[ID_EOL]                      = "ID_EOL";
        name[ID_LINE_BREAK_CR]            = "ID_LINE_BREAK_CR";
        name[ID_LINE_BREAK_LF]            = "ID_LINE_BREAK_LF";
        name[ID_LINE_BREAK_EOL]           = "ID_LINE_BREAK_EOL";
        name[ID_COMMENT_SHARP]            = "ID_COMMENT_SHARP";
        name[ID_COMMENT_EXCLAMATION]      = "ID_COMMENT_EXCLAMATION";
        name[ID_COMMENT_CHARS]            = "ID_COMMENT_CHARS";
        name[ID_COMMENT_SPACES]           = "ID_COMMENT_SPACES";
        name[ID_COMMENT_CR]               = "ID_COMMENT_CR";
        name[ID_COMMENT_LF]               = "ID_COMMENT_LF";
        name[ID_COMMENT_EOL]              = "ID_COMMENT_EOL";
        name[ID_KEY_CHARS]                = "ID_KEY_CHARS";
        name[ID_KEY_ESCAPE_CHAR]          = "ID_KEY_ESCAPE_CHAR";
        name[ID_KEY_UNICODE]              = "ID_KEY_UNICODE";
        name[ID_KEY_BAD_UNICODE]          = "ID_KEY_BAD_UNICODE";
        name[ID_KEY_CR]                   = "ID_KEY_CR";
        name[ID_KEY_LF]                   = "ID_KEY_LF";
        name[ID_KEY_EOL]                  = "ID_KEY_EOL";
        name[ID_KEY_LINE_BREAK_CR]        = "ID_KEY_LINE_BREAK_CR";
        name[ID_KEY_LINE_BREAK_LF]        = "ID_KEY_LINE_BREAK_LF";
        name[ID_KEY_LINE_BREAK_EOL]       = "ID_KEY_LINE_BREAK_EOL";
        name[ID_SEPARATOR_COLON]          = "ID_SEPARATOR_COLON";
        name[ID_SEPARATOR_EQUAL]          = "ID_SEPARATOR_EQUAL";
        name[ID_SEPARATOR_SPACES]         = "ID_SEPARATOR_SPACES";
        name[ID_SEPARATOR_CR]             = "ID_SEPARATOR_CR";
        name[ID_SEPARATOR_LF]             = "ID_SEPARATOR_LF";
        name[ID_SEPARATOR_EOL]            = "ID_SEPARATOR_EOL";
        name[ID_SEPARATOR_LINE_BREAK_CR]  = "ID_SEPARATOR_LINE_BREAK_CR";
        name[ID_SEPARATOR_LINE_BREAK_LF]  = "ID_SEPARATOR_LINE_BREAK_LF";
        name[ID_SEPARATOR_LINE_BREAK_EOL] = "ID_SEPARATOR_LINE_BREAK_EOL";
        name[ID_VALUE_SPACES]             = "ID_VALUE_SPACES";
        name[ID_VALUE_CHARS]              = "ID_VALUE_CHARS";
        name[ID_VALUE_ESCAPE_CHAR]        = "ID_VALUE_ESCAPE_CHAR";
        name[ID_VALUE_UNICODE]            = "ID_VALUE_UNICODE";
        name[ID_VALUE_BAD_UNICODE]        = "ID_VALUE_BAD_UNICODE";
        name[ID_VALUE_CR]                 = "ID_VALUE_CR";
        name[ID_VALUE_LF]                 = "ID_VALUE_LF";
        name[ID_VALUE_EOL]                = "ID_VALUE_EOL";
        name[ID_VALUE_LINE_BREAK_CR]      = "ID_VALUE_LINE_BREAK_CR";
        name[ID_VALUE_LINE_BREAK_LF]      = "ID_VALUE_LINE_BREAK_LF";
        name[ID_VALUE_LINE_BREAK_EOL]     = "ID_VALUE_LINE_BREAK_EOL";
    }